

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearCase::init(ClearCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppDVar1;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *pMVar2;
  ostringstream *this_00;
  pointer __src;
  pointer pVVar3;
  Context *pCVar4;
  RenderContext *pRVar5;
  undefined8 uVar6;
  _func_int **pp_Var7;
  TestContext *pTVar8;
  bool bVar9;
  bool bVar10;
  ContextType ctxType;
  int iVar11;
  deUint32 dVar12;
  int iVar13;
  uint uVar14;
  ShaderProgram *pSVar15;
  undefined4 extraout_var;
  ObjectWrapper *this_01;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  ulong uVar16;
  ulong uVar17;
  pointer pDVar18;
  pointer pbVar19;
  ContextInfo *pCVar20;
  Context *pCVar21;
  TestLog *pTVar22;
  NotSupportedError *pNVar23;
  TestError *pTVar24;
  ClearCase *code;
  bool setBBox;
  bool setBBox_00;
  ulong uVar25;
  long lVar26;
  char *pcVar27;
  ulong uVar28;
  size_t __n;
  char *pcVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  size_type __dnew;
  size_type __dnew_1;
  size_type __dnew_2;
  Random rnd;
  undefined1 local_398 [4];
  float fStack_394;
  undefined1 local_390 [8];
  undefined1 local_388 [28];
  float local_36c;
  undefined1 local_368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  Context *local_340;
  TestContext *local_338;
  Context local_330;
  _func_int **local_318;
  undefined1 local_310 [48];
  _func_int **local_2e0;
  value_type local_2d8;
  ulong local_2b8;
  ulong local_2b0;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  TestContext *local_228;
  undefined1 local_220 [32];
  uint local_200;
  value_type local_1f8;
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_1d8;
  long local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  undefined1 local_100 [208];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar9 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar9) {
    bVar10 = glu::ContextInfo::isExtensionSupported
                       (((this->super_TestCase).m_context)->m_contextInfo,
                        "GL_EXT_primitive_bounding_box");
    if (!bVar10) {
      pNVar23 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0._0_8_ = &local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Test requires GL_EXT_primitive_bounding_box extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar23,(string *)local_1b0);
      __cxa_throw(pNVar23,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (!bVar9 && this->m_drawTriangles == true) {
    bVar9 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_tessellation_shader");
    if (!bVar9) {
      pNVar23 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0._0_8_ = &local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Test requires GL_EXT_tessellation_shader extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar23,(string *)local_1b0);
      __cxa_throw(pNVar23,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Doing multiple",0xe);
  pcVar27 = " scissored";
  pcVar29 = glcts::fixed_sample_locations_values + 1;
  bVar9 = this->m_scissoredClear == false;
  if (bVar9) {
    pcVar27 = glcts::fixed_sample_locations_values + 1;
  }
  lVar26 = 10;
  if (bVar9) {
    lVar26 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar27,lVar26);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," color buffer clears",0x14)
  ;
  pcVar27 = " and drawing some geometry between them";
  bVar9 = this->m_drawTriangles == false;
  if (bVar9) {
    pcVar27 = glcts::fixed_sample_locations_values + 1;
  }
  lVar26 = 0x27;
  if (bVar9) {
    lVar26 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar27,lVar26);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".\n",2);
  pcVar27 = "Setting scissor area to cover entire viewport.\n";
  bVar9 = (this->m_scissoredClear & this->m_fullscreenScissor) == 0;
  if (bVar9) {
    pcVar27 = glcts::fixed_sample_locations_values + 1;
  }
  lVar26 = 0x2f;
  if (bVar9) {
    lVar26 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar27,lVar26);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Rendering with and without setting the bounding box.\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Expecting bounding box to have no effect on clears (i.e. results are constant).\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Set bounding box using ",0x17);
  pcVar27 = "gl_BoundingBoxEXT output";
  if (this->m_useGlobalState != false) {
    pcVar27 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,pcVar27,(ulong)this->m_useGlobalState * 8 + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Clear color is green with yellowish shades.\n",0x2c);
  bVar9 = this->m_drawTriangles != false;
  if (bVar9) {
    pcVar29 = "Primitive color is yellow with greenish shades.\n";
  }
  lVar26 = 0x30;
  if (!bVar9) {
    lVar26 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar29,lVar26);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  pSVar15 = (ShaderProgram *)std::ios_base::~ios_base(local_138);
  if (this->m_drawTriangles == true) {
    iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    dVar12 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                          _M_p);
    deRandom_init((deRandom *)local_1b0,dVar12);
    this_01 = (ObjectWrapper *)operator_new(0x18);
    iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    traits = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper(this_01,(Functions *)CONCAT44(extraout_var_00,iVar13),traits);
    local_398 = (undefined1  [4])0x0;
    fStack_394 = 0.0;
    if (&((this->m_vbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
          .m_data.ptr)->super_ObjectWrapper != this_01) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ::reset(&(this->m_vbo).
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             );
      (this->m_vbo).
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)this_01;
    }
    local_1c8 = CONCAT44(extraout_var,iVar11);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             *)local_398);
    uVar16 = 0;
    do {
      local_1b8 = uVar16;
      dVar12 = deRandom_getUint32((deRandom *)local_1b0);
      fVar30 = deRandom_getFloat((deRandom *)local_1b0);
      fVar31 = deRandom_getFloat((deRandom *)local_1b0);
      fVar32 = deRandom_getFloat((deRandom *)local_1b0);
      fVar33 = deRandom_getFloat((deRandom *)local_1b0);
      pDVar18 = (this->m_drawObjects).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar25 = (ulong)((long)(this->m_objectVertices).
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_objectVertices).
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4;
      uVar16 = (ulong)((dVar12 & 3) * 3 + 3);
      if (pDVar18 ==
          (this->m_drawObjects).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __src = (this->m_drawObjects).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                ._M_impl.super__Vector_impl_data._M_start;
        __n = (long)pDVar18 - (long)__src;
        if (__n == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar28 = (long)__n >> 3;
        uVar17 = uVar28;
        if (pDVar18 == __src) {
          uVar17 = 1;
        }
        local_2b0 = uVar17 + uVar28;
        if (0xffffffffffffffe < local_2b0) {
          local_2b0 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar17,uVar28)) {
          local_2b0 = 0xfffffffffffffff;
        }
        if (local_2b0 == 0) {
          pDVar18 = (pointer)0x0;
          local_36c = fVar33;
        }
        else {
          local_36c = fVar33;
          local_2b8 = uVar16;
          local_1c0 = uVar28;
          pDVar18 = (pointer)operator_new(local_2b0 * 8);
          uVar16 = local_2b8;
          uVar28 = local_1c0;
        }
        pDVar18[uVar28] = (DrawObject)(uVar25 & 0xffffffff | uVar16 << 0x20);
        if (0 < (long)__n) {
          memmove(pDVar18,__src,__n);
        }
        if (__src != (pointer)0x0) {
          operator_delete(__src,(long)(this->m_drawObjects).
                                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)__src);
        }
        (this->m_drawObjects).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar18;
        (this->m_drawObjects).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pDVar18 + __n + 8);
        (this->m_drawObjects).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar18 + local_2b0;
      }
      else {
        *pDVar18 = (DrawObject)(uVar25 & 0xffffffff | uVar16 << 0x20);
        ppDVar1 = &(this->m_drawObjects).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
        local_36c = fVar33;
      }
      fVar30 = fVar30 + fVar30 + -1.2;
      fVar31 = fVar31 + fVar31 + -1.2;
      local_36c = (local_36c * 0.8 + 0.2 + fVar31) - fVar31;
      uVar14 = 0;
      do {
        iVar11 = 3;
        do {
          fVar33 = deRandom_getFloat((deRandom *)local_1b0);
          fVar34 = deRandom_getFloat((deRandom *)local_1b0);
          local_2b0 = CONCAT44(local_2b0._4_4_,fVar34 * local_36c + fVar31);
          fVar34 = deRandom_getFloat((deRandom *)local_1b0);
          local_2b8 = CONCAT44(local_2b8._4_4_,fVar34 * 1.4 + -0.7);
          fVar34 = deRandom_getFloat((deRandom *)local_1b0);
          fStack_394 = (float)local_2b0;
          local_390 = (undefined1  [8])CONCAT44(fVar34 * 0.20000005 + 0.9,(int)local_2b8);
          local_398 = (undefined1  [4])(fVar33 * ((fVar32 * 0.8 + 0.2 + fVar30) - fVar30) + fVar30);
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                     &this->m_objectVertices,(Vector<float,_4> *)local_398);
          lVar26 = local_1c8;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        bVar9 = uVar14 != (dVar12 & 3);
        uVar14 = uVar14 + 1;
      } while (bVar9);
      uVar14 = (int)local_1b8 + 1;
      uVar16 = (ulong)uVar14;
    } while (uVar14 != 0x10);
    (**(code **)(local_1c8 + 0x40))
              (0x8892,(((this->m_vbo).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    pVVar3 = (this->m_objectVertices).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar26 + 0x150))
              (0x8892,(long)(*(int *)&(this->m_objectVertices).
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)pVVar3) &
                      0xfffffffffffffff0,pVVar3,0x88e4);
    dVar12 = (**(code **)(lVar26 + 0x800))();
    glu::checkError(dVar12,"buffer upload",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x10df);
    pSVar15 = (ShaderProgram *)operator_new(0xd0);
    pCVar4 = (this->super_TestCase).m_context;
    pRVar5 = pCVar4->m_renderCtx;
    local_100[0x10] = 0;
    local_100._17_8_ = 0;
    local_100._0_8_ = (pointer)0x0;
    local_100[8] = 0;
    local_100._9_7_ = 0;
    code = this;
    memset(local_1b0,0,0xac);
    local_310._16_8_ = local_310 + 0x20;
    local_368._0_8_ = (pointer)0x102;
    pbVar19 = (pointer)std::__cxx11::string::_M_create((ulong *)(local_310 + 0x10),(ulong)local_368)
    ;
    uVar6 = local_368._0_8_;
    local_310._32_8_ = local_368._0_8_;
    local_310._16_8_ = pbVar19;
    memcpy(pbVar19,
           "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_vertex_color;\nvoid main()\n{\n\tgl_Position = a_position;\n\t// yellowish shade\n\thighp float redComponent = 0.5 + float(gl_VertexID % 5) / 8.0;\n\tv_vertex_color = vec4(redComponent, 1.0, 0.0, 1.0);\n}\n"
           ,0x102);
    local_310._24_8_ = uVar6;
    *(char *)((long)&(pbVar19->_M_dataplus)._M_p + uVar6) = '\0';
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_248,(_anonymous_namespace_ *)pCVar4,(Context *)local_310._16_8_,(char *)code);
    _local_398 = (pointer)((ulong)(uint)fStack_394 << 0x20);
    local_390 = (undefined1  [8])(local_388 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_390,local_248._M_dataplus._M_p,
               local_248._M_dataplus._M_p + local_248._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1b0 + ((ulong)_local_398 & 0xffffffff) * 0x18),(value_type *)local_390);
    pCVar4 = (this->super_TestCase).m_context;
    local_330.m_contextInfo = (ContextInfo *)local_310;
    local_2e0 = (_func_int **)0x81;
    pCVar20 = (ContextInfo *)
              std::__cxx11::string::_M_create((ulong *)&local_330.m_contextInfo,(ulong)&local_2e0);
    pp_Var7 = local_2e0;
    local_310._0_8_ = local_2e0;
    local_330.m_contextInfo = pCVar20;
    memcpy(pCVar20,
           "${GLSL_VERSION_DECL}\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
           ,0x81);
    local_318 = pp_Var7;
    *(undefined1 *)((long)&pCVar20->_vptr_ContextInfo + (long)pp_Var7) = 0;
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_268,(_anonymous_namespace_ *)pCVar4,(Context *)local_330.m_contextInfo,
               (char *)code);
    local_368._0_4_ = 1;
    local_368._8_8_ = local_358._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_368 + 8),local_268._M_dataplus._M_p,
               local_268._M_dataplus._M_p + local_268._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1b0 + (local_368._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_368 + 8)
               );
    pCVar4 = (this->super_TestCase).m_context;
    Functional::(anonymous_namespace)::ClearCase::genTessellationControlSource_abi_cxx11_
              ((string *)local_220,(void *)0x0,setBBox);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_288,(_anonymous_namespace_ *)pCVar4,(Context *)local_220._0_8_,(char *)code);
    local_2e0 = (_func_int **)CONCAT44(local_2e0._4_4_,3);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d8,local_288._M_dataplus._M_p,
               local_288._M_dataplus._M_p + local_288._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1b0 + ((ulong)local_2e0 & 0xffffffff) * 0x18),&local_2d8);
    pCVar4 = (this->super_TestCase).m_context;
    local_340 = &local_330;
    local_228 = (TestContext *)0x1f5;
    pCVar21 = (Context *)std::__cxx11::string::_M_create((ulong *)&local_340,(ulong)&local_228);
    pTVar8 = local_228;
    local_330.m_testCtx = local_228;
    local_340 = pCVar21;
    memcpy(pCVar21,
           "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\nin highp vec4 v_tess_eval_color[];\nout highp vec4 v_color;\nprecise gl_Position;\nvoid main()\n{\n\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n\t            + gl_TessCoord.y * gl_in[1].gl_Position\n\t            + gl_TessCoord.z * gl_in[2].gl_Position;\n\tv_color = gl_TessCoord.x * v_tess_eval_color[0]\n\t        + gl_TessCoord.y * v_tess_eval_color[1]\n\t        + gl_TessCoord.z * v_tess_eval_color[2];\n}\n"
           ,0x1f5);
    local_338 = pTVar8;
    *(undefined1 *)((long)&pCVar21->m_testCtx + (long)pTVar8) = 0;
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2a8,(_anonymous_namespace_ *)pCVar4,local_340,(char *)code);
    local_200 = 4;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_2a8._M_dataplus._M_p,
               local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1b0 + (ulong)local_200 * 0x18),&local_1f8);
    glu::ShaderProgram::ShaderProgram(pSVar15,pRVar5,(ProgramSources *)local_1b0);
    local_1d8.m_data.ptr = (ShaderProgram *)0x0;
    pMVar2 = &this->m_basicProgram;
    if ((this->m_basicProgram).
        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
        pSVar15) {
      de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
                (&pMVar2->
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
      (pMVar2->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data
      .ptr = pSVar15;
    }
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if (local_340 != &local_330) {
      operator_delete(local_340,(ulong)((long)&(local_330.m_testCtx)->m_platform + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,
                      (ulong)(local_2d8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((Context *)local_220._0_8_ != (Context *)(local_220 + 0x10)) {
      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
    }
    if ((char *)local_368._8_8_ != local_358._M_local_buf + 8) {
      operator_delete((void *)local_368._8_8_,
                      CONCAT17(local_358._M_local_buf[0xf],
                               CONCAT16(local_358._M_local_buf[0xe],local_358._8_6_)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_330.m_contextInfo != (ContextInfo *)local_310) {
      operator_delete(local_330.m_contextInfo,local_310._0_8_ + 1);
    }
    if (local_390 != (undefined1  [8])(local_388 + 8)) {
      operator_delete((void *)local_390,local_388._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_310._16_8_ != (pointer)(local_310 + 0x20)) {
      operator_delete((void *)local_310._16_8_,
                      (ulong)((long)&((_Alloc_hider *)local_310._32_8_)->_M_p + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_120);
    lVar26 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1b0 + lVar26));
      lVar26 = lVar26 + -0x18;
    } while (lVar26 != -0x18);
    pTVar22 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_390 = (undefined1  [8])0x7;
    local_388._0_8_ = (Functions *)0x6d6172676f7250;
    local_358._M_allocated_capacity._0_6_ = 0x726564616853;
    pcVar27 = (char *)0x6d6172676f727020;
    local_358._M_allocated_capacity._6_2_ = 0x7020;
    local_358._8_6_ = 0x6d6172676f72;
    local_368._8_8_ = 0xe;
    local_358._M_local_buf[0xe] = '\0';
    _local_398 = (pointer)local_388;
    local_368._0_8_ = &local_358;
    tcu::LogSection::LogSection((LogSection *)local_1b0,(string *)local_398,(string *)local_368);
    tcu::TestLog::startSection(pTVar22,(char *)local_1b0._0_8_,local_190._M_p);
    pTVar22 = glu::operator<<(pTVar22,(pMVar2->
                                      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                      ).m_data.ptr);
    tcu::TestLog::endSection(pTVar22);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,(ulong)(local_180[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._0_8_ != &local_358) {
      operator_delete((void *)local_368._0_8_,
                      CONCAT26(local_358._M_allocated_capacity._6_2_,
                               local_358._M_allocated_capacity._0_6_) + 1);
    }
    if ((TypedObjectWrapper<(glu::ObjectType)1> *)_local_398 !=
        (TypedObjectWrapper<(glu::ObjectType)1> *)local_388) {
      operator_delete(_local_398,(ulong)(local_388._0_8_ + 1));
    }
    pSVar15 = (pMVar2->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
              ).m_data.ptr;
    if ((pSVar15->m_program).m_info.linkOk == false) {
      pTVar24 = (TestError *)__cxa_allocate_exception(0x38);
      local_1b0._0_8_ = &local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"shader build failed","");
      tcu::TestError::TestError(pTVar24,(string *)local_1b0);
      __cxa_throw(pTVar24,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (this->m_useGlobalState == false) {
      pSVar15 = (ShaderProgram *)operator_new(0xd0);
      pCVar4 = (this->super_TestCase).m_context;
      pRVar5 = pCVar4->m_renderCtx;
      local_100[0x10] = 0;
      local_100._17_8_ = 0;
      local_100._0_8_ = (pointer)0x0;
      local_100[8] = 0;
      local_100._9_7_ = 0;
      memset(local_1b0,0,0xac);
      local_310._16_8_ = local_310 + 0x20;
      local_368._0_8_ = (pointer)0x102;
      pbVar19 = (pointer)std::__cxx11::string::_M_create
                                   ((ulong *)(local_310 + 0x10),(ulong)local_368);
      uVar6 = local_368._0_8_;
      local_310._32_8_ = local_368._0_8_;
      local_310._16_8_ = pbVar19;
      memcpy(pbVar19,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_vertex_color;\nvoid main()\n{\n\tgl_Position = a_position;\n\t// yellowish shade\n\thighp float redComponent = 0.5 + float(gl_VertexID % 5) / 8.0;\n\tv_vertex_color = vec4(redComponent, 1.0, 0.0, 1.0);\n}\n"
             ,0x102);
      local_310._24_8_ = uVar6;
      *(char *)((long)&(pbVar19->_M_dataplus)._M_p + uVar6) = '\0';
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_248,(_anonymous_namespace_ *)pCVar4,(Context *)local_310._16_8_,pcVar27);
      _local_398 = _local_398 & 0xffffffff00000000;
      local_390 = (undefined1  [8])(local_388 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_390,local_248._M_dataplus._M_p,
                 local_248._M_dataplus._M_p + local_248._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)_local_398 & 0xffffffff) * 0x18),(value_type *)local_390);
      pCVar4 = (this->super_TestCase).m_context;
      local_330.m_contextInfo = (ContextInfo *)local_310;
      local_2e0 = (_func_int **)0x81;
      pCVar20 = (ContextInfo *)
                std::__cxx11::string::_M_create((ulong *)&local_330.m_contextInfo,(ulong)&local_2e0)
      ;
      pp_Var7 = local_2e0;
      local_310._0_8_ = local_2e0;
      local_330.m_contextInfo = pCVar20;
      memcpy(pCVar20,
             "${GLSL_VERSION_DECL}\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,0x81);
      local_318 = pp_Var7;
      *(undefined1 *)((long)&pCVar20->_vptr_ContextInfo + (long)pp_Var7) = 0;
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_268,(_anonymous_namespace_ *)pCVar4,(Context *)local_330.m_contextInfo,
                 pcVar27);
      local_368._0_4_ = 1;
      local_368._8_8_ = local_358._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_368 + 8),local_268._M_dataplus._M_p,
                 local_268._M_dataplus._M_p + local_268._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + (local_368._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_368 + 8));
      pCVar4 = (this->super_TestCase).m_context;
      Functional::(anonymous_namespace)::ClearCase::genTessellationControlSource_abi_cxx11_
                ((string *)local_220,&DAT_00000001,setBBox_00);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_288,(_anonymous_namespace_ *)pCVar4,(Context *)local_220._0_8_,pcVar27);
      local_2e0 = (_func_int **)CONCAT44(local_2e0._4_4_,3);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,local_288._M_dataplus._M_p,
                 local_288._M_dataplus._M_p + local_288._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_2e0 & 0xffffffff) * 0x18),&local_2d8);
      pCVar4 = (this->super_TestCase).m_context;
      local_340 = &local_330;
      local_228 = (TestContext *)0x1f5;
      pCVar21 = (Context *)std::__cxx11::string::_M_create((ulong *)&local_340,(ulong)&local_228);
      pTVar8 = local_228;
      local_330.m_testCtx = local_228;
      local_340 = pCVar21;
      memcpy(pCVar21,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\nin highp vec4 v_tess_eval_color[];\nout highp vec4 v_color;\nprecise gl_Position;\nvoid main()\n{\n\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n\t            + gl_TessCoord.y * gl_in[1].gl_Position\n\t            + gl_TessCoord.z * gl_in[2].gl_Position;\n\tv_color = gl_TessCoord.x * v_tess_eval_color[0]\n\t        + gl_TessCoord.y * v_tess_eval_color[1]\n\t        + gl_TessCoord.z * v_tess_eval_color[2];\n}\n"
             ,0x1f5);
      local_338 = pTVar8;
      *(undefined1 *)((long)&pCVar21->m_testCtx + (long)pTVar8) = 0;
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2a8,(_anonymous_namespace_ *)pCVar4,local_340,pcVar27);
      local_200 = 4;
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_2a8._M_dataplus._M_p,
                 local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + (ulong)local_200 * 0x18),&local_1f8);
      glu::ShaderProgram::ShaderProgram(pSVar15,pRVar5,(ProgramSources *)local_1b0);
      local_1d8.m_data.ptr = (ShaderProgram *)0x0;
      pMVar2 = &this->m_perPrimitiveProgram;
      if ((this->m_perPrimitiveProgram).
          super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr
          != pSVar15) {
        de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
                  (&pMVar2->
                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
        (pMVar2->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
        m_data.ptr = pSVar15;
      }
      de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
                (&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if (local_340 != &local_330) {
        operator_delete(local_340,(ulong)((long)&(local_330.m_testCtx)->m_platform + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,
                        (ulong)(local_2d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((Context *)local_220._0_8_ != (Context *)(local_220 + 0x10)) {
        operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
      }
      if ((char *)local_368._8_8_ != local_358._M_local_buf + 8) {
        operator_delete((void *)local_368._8_8_,
                        CONCAT17(local_358._M_local_buf[0xf],
                                 CONCAT16(local_358._M_local_buf[0xe],local_358._8_6_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if (local_330.m_contextInfo != (ContextInfo *)local_310) {
        operator_delete(local_330.m_contextInfo,local_310._0_8_ + 1);
      }
      if (local_390 != (undefined1  [8])(local_388 + 8)) {
        operator_delete((void *)local_390,local_388._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_310._16_8_ != (pointer)(local_310 + 0x20)) {
        operator_delete((void *)local_310._16_8_,
                        (ulong)((long)&((_Alloc_hider *)local_310._32_8_)->_M_p + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_120);
      lVar26 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + lVar26));
        lVar26 = lVar26 + -0x18;
      } while (lVar26 != -0x18);
      pTVar22 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_368._0_8_ = &DAT_00000013;
      _local_398 = (pointer)local_388;
      _local_398 = (pointer)std::__cxx11::string::_M_create((ulong *)local_398,(ulong)local_368);
      local_388._0_8_ = local_368._0_8_;
      (((TypedObjectWrapper<(glu::ObjectType)1> *)_local_398)->super_ObjectWrapper).m_gl =
           (Functions *)0x696d697250726550;
      (((TypedObjectWrapper<(glu::ObjectType)1> *)_local_398)->super_ObjectWrapper).m_traits =
           (ObjectTraits *)0x676f725065766974;
      *(undefined4 *)
       ((long)&(((TypedObjectWrapper<(glu::ObjectType)1> *)_local_398)->super_ObjectWrapper).
               m_traits + 7) = 0x6d617267;
      local_390 = (undefined1  [8])local_368._0_8_;
      *(char *)((long)&(((TypedObjectWrapper<(glu::ObjectType)1> *)_local_398)->super_ObjectWrapper)
                       .m_gl + local_368._0_8_) = '\0';
      local_2e0 = (_func_int **)0x29;
      local_368._0_8_ = &local_358;
      local_368._0_8_ = std::__cxx11::string::_M_create((ulong *)local_368,(ulong)&local_2e0);
      local_358._M_allocated_capacity._0_6_ = SUB86(local_2e0,0);
      local_358._M_allocated_capacity._6_2_ = (undefined2)((ulong)local_2e0 >> 0x30);
      *(char *)(local_368._0_8_ + 0x19) = 't';
      *(char *)(local_368._0_8_ + 0x1a) = 'h';
      *(char *)(local_368._0_8_ + 0x1b) = 'e';
      *(char *)(local_368._0_8_ + 0x1c) = ' ';
      *(char *)(local_368._0_8_ + 0x1d) = 'b';
      *(char *)(local_368._0_8_ + 0x1e) = 'o';
      *(char *)(local_368._0_8_ + 0x1f) = 'u';
      *(char *)(local_368._0_8_ + 0x20) = 'n';
      *(char *)(local_368._0_8_ + 0x21) = 'd';
      *(char *)(local_368._0_8_ + 0x22) = 'i';
      *(char *)(local_368._0_8_ + 0x23) = 'n';
      *(char *)(local_368._0_8_ + 0x24) = 'g';
      *(char *)(local_368._0_8_ + 0x25) = ' ';
      *(char *)(local_368._0_8_ + 0x26) = 'b';
      *(char *)(local_368._0_8_ + 0x27) = 'o';
      *(char *)(local_368._0_8_ + 0x28) = 'x';
      *(char *)(local_368._0_8_ + 0x10) = 'h';
      *(char *)(local_368._0_8_ + 0x11) = 'a';
      *(char *)(local_368._0_8_ + 0x12) = 't';
      *(char *)(local_368._0_8_ + 0x13) = ' ';
      *(char *)(local_368._0_8_ + 0x14) = 's';
      *(char *)(local_368._0_8_ + 0x15) = 'e';
      *(char *)(local_368._0_8_ + 0x16) = 't';
      *(char *)(local_368._0_8_ + 0x17) = 's';
      *(char *)(local_368._0_8_ + 0x18) = ' ';
      *(char *)(local_368._0_8_ + 0x19) = 't';
      *(char *)(local_368._0_8_ + 0x1a) = 'h';
      *(char *)(local_368._0_8_ + 0x1b) = 'e';
      *(char *)(local_368._0_8_ + 0x1c) = ' ';
      *(char *)(local_368._0_8_ + 0x1d) = 'b';
      *(char *)(local_368._0_8_ + 0x1e) = 'o';
      *(char *)(local_368._0_8_ + 0x1f) = 'u';
      *(undefined8 *)local_368._0_8_ = 0x7020726564616853;
      *(char *)(local_368._0_8_ + 8) = 'r';
      *(char *)(local_368._0_8_ + 9) = 'o';
      *(char *)(local_368._0_8_ + 10) = 'g';
      *(char *)(local_368._0_8_ + 0xb) = 'r';
      *(char *)(local_368._0_8_ + 0xc) = 'a';
      *(char *)(local_368._0_8_ + 0xd) = 'm';
      *(char *)(local_368._0_8_ + 0xe) = ' ';
      *(char *)(local_368._0_8_ + 0xf) = 't';
      local_368._8_8_ = local_2e0;
      *(char *)(local_368._0_8_ + (long)local_2e0) = '\0';
      tcu::LogSection::LogSection((LogSection *)local_1b0,(string *)local_398,(string *)local_368);
      tcu::TestLog::startSection(pTVar22,(char *)local_1b0._0_8_,local_190._M_p);
      pTVar22 = glu::operator<<(pTVar22,(pMVar2->
                                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                        ).m_data.ptr);
      tcu::TestLog::endSection(pTVar22);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != local_180) {
        operator_delete(local_190._M_p,(ulong)(local_180[0]._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != &local_1a0) {
        operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._0_8_ != &local_358) {
        operator_delete((void *)local_368._0_8_,
                        CONCAT26(local_358._M_allocated_capacity._6_2_,
                                 local_358._M_allocated_capacity._0_6_) + 1);
      }
      if ((TypedObjectWrapper<(glu::ObjectType)1> *)_local_398 !=
          (TypedObjectWrapper<(glu::ObjectType)1> *)local_388) {
        operator_delete(_local_398,(ulong)(local_388._0_8_ + 1));
      }
      pSVar15 = (pMVar2->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
                m_data.ptr;
      if ((pSVar15->m_program).m_info.linkOk == false) {
        pTVar24 = (TestError *)__cxa_allocate_exception(0x38);
        local_1b0._0_8_ = &local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"shader build failed","");
        tcu::TestError::TestError(pTVar24,(string *)local_1b0);
        __cxa_throw(pTVar24,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return (int)pSVar15;
}

Assistant:

void ClearCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_drawTriangles && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Doing multiple"
			<< ((m_scissoredClear) ? (" scissored") : (""))
			<< " color buffer clears"
			<< ((m_drawTriangles) ? (" and drawing some geometry between them") : (""))
			<< ".\n"
		<< ((m_scissoredClear && m_fullscreenScissor) ? ("Setting scissor area to cover entire viewport.\n") : (""))
		<< "Rendering with and without setting the bounding box.\n"
		<< "Expecting bounding box to have no effect on clears (i.e. results are constant).\n"
		<< "Set bounding box using "
			<< ((m_useGlobalState) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< ".\n"
		<< "Clear color is green with yellowish shades.\n"
		<< ((m_drawTriangles) ? ("Primitive color is yellow with greenish shades.\n") : (""))
		<< tcu::TestLog::EndMessage;

	if (m_drawTriangles)
	{
		createVbo();
		createProgram();
	}
}